

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerObjectDumper.cpp
# Opt level: O2

BOOL RecyclerObjectDumper::EnsureDumpFunctionMap(void)

{
  uint uVar1;
  
  if (dumpFunctionMap == (DumpFunctionMap *)0x0) {
    dumpFunctionMap =
         (DumpFunctionMap *)
         Memory::NoCheckHeapAllocator::Alloc
                   ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,0x38);
    dumpFunctionMap->buckets = (Type)0x0;
    dumpFunctionMap->entries = (Type)0x0;
    dumpFunctionMap->alloc = (Type)&Memory::NoCheckHeapAllocator::Instance;
    dumpFunctionMap->size = 0;
    dumpFunctionMap->bucketCount = 0;
    dumpFunctionMap->count = 0;
    dumpFunctionMap->freeCount = 0;
    dumpFunctionMap->modFunctionIndex = 0x4b;
    dumpFunctionMap->stats = (Type)0x0;
    uVar1 = (uint)(dumpFunctionMap != (DumpFunctionMap *)0x0);
  }
  else {
    uVar1 = 1;
  }
  return uVar1;
}

Assistant:

BOOL
RecyclerObjectDumper::EnsureDumpFunctionMap()
{
    if (dumpFunctionMap == nullptr)
    {
        dumpFunctionMap = NoCheckHeapNew(DumpFunctionMap, &NoCheckHeapAllocator::Instance);
    }
    return (dumpFunctionMap != nullptr);
}